

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O2

timespec fio_timer_calc_due(size_t interval)

{
  long lVar1;
  long lVar2;
  long lVar3;
  timespec tVar4;
  
  lVar2 = (fio_data->last_cycle).tv_sec;
  lVar3 = (fio_data->last_cycle).tv_nsec;
  if (999 < interval) {
    lVar2 = lVar2 + interval / 1000;
    interval = interval % 1000;
  }
  lVar1 = interval * 1000000 + lVar3;
  lVar3 = interval * 1000000 + -1000000000 + lVar3;
  if (lVar1 < 1000000000) {
    lVar3 = lVar1;
  }
  tVar4.tv_sec = (ulong)(999999999 < lVar1) + lVar2;
  tVar4.tv_nsec = lVar3;
  return tVar4;
}

Assistant:

static struct timespec fio_timer_calc_due(size_t interval) {
  struct timespec now = fio_last_tick();
  if (interval >= 1000) {
    unsigned long long secs = interval / 1000;
    now.tv_sec += secs;
    interval -= secs * 1000;
  }
  now.tv_nsec += (interval * 1000000UL);
  if (now.tv_nsec >= 1000000000L) {
    now.tv_nsec -= 1000000000L;
    now.tv_sec += 1;
  }
  return now;
}